

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::SourceCodeInfo_Location::SerializeWithCachedSizes
          (SourceCodeInfo_Location *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  int32 iVar4;
  char *pcVar5;
  string *psVar6;
  UnknownFieldSet *pUVar7;
  int local_60;
  int local_5c;
  int i_1;
  int i;
  CodedOutputStream *output_local;
  SourceCodeInfo_Location *this_local;
  
  iVar2 = path_size(this);
  if (0 < iVar2) {
    uVar3 = internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    io::CodedOutputStream::WriteTag(output,uVar3);
    io::CodedOutputStream::WriteVarint32(output,this->_path_cached_byte_size_);
  }
  for (local_5c = 0; iVar2 = path_size(this), local_5c < iVar2; local_5c = local_5c + 1) {
    iVar4 = path(this,local_5c);
    io::CodedOutputStream::WriteVarint32SignExtended(output,iVar4);
  }
  iVar2 = span_size(this);
  if (0 < iVar2) {
    uVar3 = internal::WireFormatLite::MakeTag(2,WIRETYPE_LENGTH_DELIMITED);
    io::CodedOutputStream::WriteTag(output,uVar3);
    io::CodedOutputStream::WriteVarint32(output,this->_span_cached_byte_size_);
  }
  for (local_60 = 0; iVar2 = span_size(this), local_60 < iVar2; local_60 = local_60 + 1) {
    iVar4 = span(this,local_60);
    io::CodedOutputStream::WriteVarint32SignExtended(output,iVar4);
  }
  bVar1 = has_leading_comments(this);
  if (bVar1) {
    leading_comments_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    leading_comments_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar5,iVar2,SERIALIZE);
    psVar6 = leading_comments_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(3,psVar6,output);
  }
  bVar1 = has_trailing_comments(this);
  if (bVar1) {
    trailing_comments_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    trailing_comments_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar5,iVar2,SERIALIZE);
    psVar6 = trailing_comments_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(4,psVar6,output);
  }
  pUVar7 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar7);
  if (!bVar1) {
    pUVar7 = unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(pUVar7,output);
  }
  return;
}

Assistant:

void SourceCodeInfo_Location::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // repeated int32 path = 1 [packed = true];
  if (this->path_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_path_cached_byte_size_);
  }
  for (int i = 0; i < this->path_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32NoTag(
      this->path(i), output);
  }

  // repeated int32 span = 2 [packed = true];
  if (this->span_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_span_cached_byte_size_);
  }
  for (int i = 0; i < this->span_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32NoTag(
      this->span(i), output);
  }

  // optional string leading_comments = 3;
  if (has_leading_comments()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->leading_comments().data(), this->leading_comments().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      3, this->leading_comments(), output);
  }

  // optional string trailing_comments = 4;
  if (has_trailing_comments()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->trailing_comments().data(), this->trailing_comments().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      4, this->trailing_comments(), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}